

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O3

string * __thiscall
toml::detail::concat_to_string_impl<char_const(&)[29],std::__cxx11::string,char_const(&)[33]>
          (string *__return_storage_ptr__,detail *this,ostringstream *oss,char (*head) [29],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,
          char (*tail_1) [33])

{
  size_t sVar1;
  char (*head_00) [33];
  
  head_00 = (char (*) [33])head;
  sVar1 = strlen((char *)oss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)oss,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,*(char **)*head,*(long *)(*head + 8));
  concat_to_string_impl<char_const(&)[33]>
            (__return_storage_ptr__,this,(ostringstream *)tail,head_00);
  return __return_storage_ptr__;
}

Assistant:

std::string concat_to_string_impl(std::ostringstream& oss, T&& head, Ts&& ... tail)
{
    oss << std::forward<T>(head);
    return concat_to_string_impl(oss, std::forward<Ts>(tail) ... );
}